

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix_func.c
# Opt level: O3

void xc_mix_func(long *func,size_t np,double *rho,double *sigma,undefined8 lapl,undefined8 tau,
                long zk,long vrho,long vsigma,long vlapl,long vtau,long v2rho2,long v2rhosigma,
                long v2rholapl,long v2rhotau,long v2sigma2,long v2sigmalapl,long v2sigmatau,
                long v2lapl2,long v2lapltau,long v2tau2,long v3rho3)

{
  int iVar1;
  uint uVar2;
  xc_func_type *p;
  xc_func_info_type *pxVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  long v4rho4;
  double *xv2rho2;
  double *xvrho;
  double *xzk;
  size_t local_278;
  double *xv4rho4;
  double *xv3rho3;
  double *xv2sigma2;
  double *xv2rhosigma;
  double *xvsigma;
  double *xv4sigma4;
  double *xv4rhosigma3;
  double *xv4rho2sigma2;
  double *xv4rho3sigma;
  double *xv3sigma3;
  double *xv3rhosigma2;
  double *xv3rho2sigma;
  double *xv2tau2;
  double *xv2lapltau;
  double *xv2lapl2;
  double *xv2sigmatau;
  double *xv2sigmalapl;
  double *xv2rhotau;
  double *xv2rholapl;
  double *xvtau;
  double *xvlapl;
  long *local_1c8;
  double *local_1c0;
  double *xv4tau4;
  double *xv4lapltau3;
  double *xv4lapl2tau2;
  double *xv4lapl3tau;
  double *xv4lapl4;
  double *xv4sigmalapltau2;
  double *xv4sigmalapl2tau;
  double *xv4sigmalapl3;
  double *xv4sigma2tau2;
  double *xv4sigma2lapltau;
  double *xv4sigma2lapl2;
  double *xv4sigma3tau;
  double *xv4sigma3lapl;
  double *xv4rhotau3;
  double *xv4rholapltau2;
  double *xv4rholapl2tau;
  double *xv4rholapl3;
  double *xv4rhosigmatau2;
  double *xv4rhosigmalapltau;
  double *xv4rhosigmalapl2;
  double *xv4rhosigma2tau;
  double *xv4rhosigma2lapl;
  double *xv4rho2tau2;
  double *xv4rho2lapltau;
  double *xv4rho2lapl2;
  double *xv4rho2sigmatau;
  double *xv4rho2sigmalapl;
  double *xv4rho3tau;
  double *xv4rho3lapl;
  double *xv3tau3;
  double *xv3lapltau2;
  double *xv3lapl2tau;
  double *xv3lapl3;
  double *xv3sigmatau2;
  double *xv3sigmalapltau;
  double *xv3sigmalapl2;
  double *xv3sigma2tau;
  double *xv3sigma2lapl;
  double *xv3rhotau2;
  double *xv3rholapltau;
  double *xv3rholapl2;
  double *xv3rhosigmatau;
  double *xv3rhosigmalapl;
  double *xv3rho2tau;
  double *xv3rho2lapl;
  double *local_50;
  double *xv4sigmatau3;
  undefined8 local_40;
  undefined8 local_38;
  
  xv4tau4 = (double *)0x0;
  xv4lapltau3 = (double *)0x0;
  xv4lapl2tau2 = (double *)0x0;
  xv4lapl3tau = (double *)0x0;
  xv4lapl4 = (double *)0x0;
  xv4sigmatau3 = (double *)0x0;
  xv4sigmalapltau2 = (double *)0x0;
  xv4sigmalapl2tau = (double *)0x0;
  xv4sigmalapl3 = (double *)0x0;
  xv4sigma2tau2 = (double *)0x0;
  xv4sigma2lapltau = (double *)0x0;
  xv4sigma2lapl2 = (double *)0x0;
  xv4sigma3tau = (double *)0x0;
  xv4sigma3lapl = (double *)0x0;
  xv4sigma4 = (double *)0x0;
  xv4rhotau3 = (double *)0x0;
  xv4rholapltau2 = (double *)0x0;
  xv4rholapl2tau = (double *)0x0;
  xv4rholapl3 = (double *)0x0;
  xv4rhosigmatau2 = (double *)0x0;
  xv4rhosigmalapltau = (double *)0x0;
  xv4rhosigmalapl2 = (double *)0x0;
  xv4rhosigma2tau = (double *)0x0;
  xv4rhosigma2lapl = (double *)0x0;
  xv4rhosigma3 = (double *)0x0;
  xv4rho2tau2 = (double *)0x0;
  xv4rho2lapltau = (double *)0x0;
  xv4rho2lapl2 = (double *)0x0;
  xv4rho2sigmatau = (double *)0x0;
  xv4rho2sigmalapl = (double *)0x0;
  xv4rho2sigma2 = (double *)0x0;
  xv4rho3tau = (double *)0x0;
  xv4rho3lapl = (double *)0x0;
  xv4rho3sigma = (double *)0x0;
  xv4rho4 = (double *)0x0;
  xv3tau3 = (double *)0x0;
  xv3lapltau2 = (double *)0x0;
  xv3lapl2tau = (double *)0x0;
  xv3lapl3 = (double *)0x0;
  xv3sigmatau2 = (double *)0x0;
  xv3sigmalapltau = (double *)0x0;
  xv3sigmalapl2 = (double *)0x0;
  xv3sigma2tau = (double *)0x0;
  xv3sigma2lapl = (double *)0x0;
  xv3sigma3 = (double *)0x0;
  xv3rhotau2 = (double *)0x0;
  xv3rholapltau = (double *)0x0;
  xv3rholapl2 = (double *)0x0;
  xv3rhosigmatau = (double *)0x0;
  xv3rhosigmalapl = (double *)0x0;
  xv3rhosigma2 = (double *)0x0;
  xv3rho2tau = (double *)0x0;
  xv3rho2lapl = (double *)0x0;
  xv3rho2sigma = (double *)0x0;
  xv3rho3 = (double *)0x0;
  xv2tau2 = (double *)0x0;
  xv2lapltau = (double *)0x0;
  xv2lapl2 = (double *)0x0;
  xv2sigmatau = (double *)0x0;
  xv2sigmalapl = (double *)0x0;
  xv2sigma2 = (double *)0x0;
  xv2rhotau = (double *)0x0;
  xv2rholapl = (double *)0x0;
  xv2rhosigma = (double *)0x0;
  xv2rho2 = (double *)0x0;
  xvtau = (double *)0x0;
  xvlapl = (double *)0x0;
  xvsigma = (double *)0x0;
  xvrho = (double *)0x0;
  xzk = (double *)0x0;
  local_1c0 = rho;
  local_50 = sigma;
  local_40 = lapl;
  local_38 = tau;
  xc_mgga_vars_allocate_all
            (*(undefined4 *)(*func + 0x10),np,func + 9,zk != 0,vrho != 0,v2rho2 != 0,v3rho3 != 0,
             v4rho4 != 0,&xzk,&xvrho,&xvsigma,&xvlapl,&xvtau,&xv2rho2,&xv2rhosigma,&xv2rholapl,
             &xv2rhotau,&xv2sigma2,&xv2sigmalapl,&xv2sigmatau,&xv2lapl2,&xv2lapltau,&xv2tau2,
             &xv3rho3,&xv3rho2sigma,&xv3rho2lapl,&xv3rho2tau,&xv3rhosigma2,&xv3rhosigmalapl,
             &xv3rhosigmatau,&xv3rholapl2,&xv3rholapltau,&xv3rhotau2,&xv3sigma3,&xv3sigma2lapl,
             &xv3sigma2tau,&xv3sigmalapl2,&xv3sigmalapltau,&xv3sigmatau2,&xv3lapl3,&xv3lapl2tau,
             &xv3lapltau2,&xv3tau3,&xv4rho4,&xv4rho3sigma,&xv4rho3lapl,&xv4rho3tau,&xv4rho2sigma2,
             &xv4rho2sigmalapl,&xv4rho2sigmatau,&xv4rho2lapl2,&xv4rho2lapltau,&xv4rho2tau2,
             &xv4rhosigma3,&xv4rhosigma2lapl,&xv4rhosigma2tau,&xv4rhosigmalapl2,&xv4rhosigmalapltau,
             &xv4rhosigmatau2,&xv4rholapl3,&xv4rholapl2tau,&xv4rholapltau2,&xv4rhotau3,&xv4sigma4,
             &xv4sigma3lapl,&xv4sigma3tau,&xv4sigma2lapl2,&xv4sigma2lapltau);
  if (0 < *(int *)((long)func + 0xc)) {
    lVar7 = 0;
    local_278 = np;
    local_1c8 = func;
    do {
      p = *(xc_func_type **)(func[2] + lVar7 * 8);
      iVar1 = p->info->family;
      if (iVar1 < 0x20) {
        if (iVar1 == 1) {
LAB_00ef2145:
          xc_lda(p,local_278,local_1c0,xzk,xvrho,xv2rho2,xv3rho3,xv4rho4);
          np = local_278;
          func = local_1c8;
        }
        else {
          if (iVar1 == 2) goto LAB_00ef2191;
          if (iVar1 == 4) goto LAB_00ef222e;
        }
      }
      else {
        if (iVar1 != 0x20) {
          if (iVar1 == 0x40) {
LAB_00ef222e:
            xc_mgga(p,np,local_1c0,local_50,local_40,local_38,xzk,xvrho,xvsigma,xvlapl,xvtau,xv2rho2
                    ,xv2rhosigma,xv2rholapl,xv2rhotau,xv2sigma2,xv2sigmalapl,xv2sigmatau,xv2lapl2,
                    xv2lapltau,xv2tau2,xv3rho3,xv3rho2sigma,xv3rho2lapl,xv3rho2tau,xv3rhosigma2,
                    xv3rhosigmalapl,xv3rhosigmatau,xv3rholapl2,xv3rholapltau,xv3rhotau2,xv3sigma3,
                    xv3sigma2lapl,xv3sigma2tau,xv3sigmalapl2,xv3sigmalapltau,xv3sigmatau2,xv3lapl3,
                    xv3lapl2tau,xv3lapltau2,xv3tau3,xv4rho4,xv4rho3sigma,xv4rho3lapl,xv4rho3tau,
                    xv4rho2sigma2,xv4rho2sigmalapl,xv4rho2sigmatau,xv4rho2lapl2,xv4rho2lapltau,
                    xv4rho2tau2,xv4rhosigma3,xv4rhosigma2lapl,xv4rhosigma2tau,xv4rhosigmalapl2,
                    xv4rhosigmalapltau,xv4rhosigmatau2,xv4rholapl3,xv4rholapl2tau,xv4rholapltau2,
                    xv4rhotau3,xv4sigma4,xv4sigma3lapl,xv4sigma3tau,xv4sigma2lapl2,xv4sigma2lapltau,
                    xv4sigma2tau2,xv4sigmalapl3);
            np = local_278;
            func = local_1c8;
            goto LAB_00ef2464;
          }
          if (iVar1 != 0x80) goto LAB_00ef2464;
          goto LAB_00ef2145;
        }
LAB_00ef2191:
        xc_gga(p,local_278,local_1c0,local_50,xzk,xvrho,xvsigma,xv2rho2,xv2rhosigma,xv2sigma2,
               xv3rho3,xv3rho2sigma,xv3rhosigma2,xv3sigma3,xv4rho4,xv4rho3sigma,xv4rho2sigma2,
               xv4rhosigma3,xv4sigma4);
        np = local_278;
        func = local_1c8;
      }
LAB_00ef2464:
      if ((zk != 0) && (lVar4 = (long)(int)func[0xb] * np, lVar4 != 0)) {
        dVar8 = *(double *)(func[3] + lVar7 * 8);
        lVar5 = 0;
        do {
          *(double *)(zk + lVar5 * 8) = xzk[lVar5] * dVar8 + *(double *)(zk + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar4 - lVar5 != 0);
      }
      if (vrho != 0) {
        lVar5 = (long)*(int *)((long)func + 0x5c) * np;
        lVar4 = func[3];
        if (lVar5 != 0) {
          dVar8 = *(double *)(lVar4 + lVar7 * 8);
          lVar6 = 0;
          do {
            *(double *)(vrho + lVar6 * 8) = xvrho[lVar6] * dVar8 + *(double *)(vrho + lVar6 * 8);
            lVar6 = lVar6 + 1;
          } while (lVar5 - lVar6 != 0);
        }
        pxVar3 = p->info;
        iVar1 = pxVar3->family;
        if ((iVar1 - 2U < 0x3f) && ((0x4000000040000005U >> ((ulong)(iVar1 - 2U) & 0x3f) & 1) != 0))
        {
          lVar5 = (long)(int)func[0xc] * np;
          if (lVar5 != 0) {
            dVar8 = *(double *)(lVar4 + lVar7 * 8);
            lVar6 = 0;
            do {
              *(double *)(vsigma + lVar6 * 8) =
                   xvsigma[lVar6] * dVar8 + *(double *)(vsigma + lVar6 * 8);
              lVar6 = lVar6 + 1;
            } while (lVar5 - lVar6 != 0);
          }
          if ((iVar1 == 0x40) || (iVar1 == 4)) {
            uVar2 = pxVar3->flags;
            if (((short)uVar2 < 0) && (lVar5 = (long)*(int *)((long)func + 100) * np, lVar5 != 0)) {
              dVar8 = *(double *)(lVar4 + lVar7 * 8);
              lVar6 = 0;
              do {
                *(double *)(vlapl + lVar6 * 8) =
                     xvlapl[lVar6] * dVar8 + *(double *)(vlapl + lVar6 * 8);
                lVar6 = lVar6 + 1;
              } while (lVar5 - lVar6 != 0);
            }
            if (((uVar2 >> 0x10 & 1) != 0) && (lVar5 = (long)(int)func[0xd] * np, lVar5 != 0)) {
              dVar8 = *(double *)(lVar4 + lVar7 * 8);
              lVar4 = 0;
              do {
                *(double *)(vtau + lVar4 * 8) = xvtau[lVar4] * dVar8 + *(double *)(vtau + lVar4 * 8)
                ;
                lVar4 = lVar4 + 1;
              } while (lVar5 - lVar4 != 0);
            }
          }
        }
      }
      if (v2rho2 != 0) {
        lVar5 = (long)*(int *)((long)func + 0x6c) * np;
        lVar4 = func[3];
        if (lVar5 != 0) {
          dVar8 = *(double *)(lVar4 + lVar7 * 8);
          lVar6 = 0;
          do {
            *(double *)(v2rho2 + lVar6 * 8) =
                 xv2rho2[lVar6] * dVar8 + *(double *)(v2rho2 + lVar6 * 8);
            lVar6 = lVar6 + 1;
          } while (lVar5 - lVar6 != 0);
        }
        pxVar3 = p->info;
        iVar1 = pxVar3->family;
        if ((iVar1 - 2U < 0x3f) && ((0x4000000040000005U >> ((ulong)(iVar1 - 2U) & 0x3f) & 1) != 0))
        {
          lVar5 = (long)(int)func[0xe] * np;
          dVar8 = *(double *)(lVar4 + lVar7 * 8);
          if (lVar5 != 0) {
            lVar6 = 0;
            do {
              *(double *)(v2rhosigma + lVar6 * 8) =
                   xv2rhosigma[lVar6] * dVar8 + *(double *)(v2rhosigma + lVar6 * 8);
              lVar6 = lVar6 + 1;
            } while (lVar5 - lVar6 != 0);
            dVar8 = *(double *)(lVar4 + lVar7 * 8);
          }
          lVar5 = (long)*(int *)((long)func + 0x7c) * np;
          if (lVar5 != 0) {
            lVar6 = 0;
            do {
              *(double *)(v2sigma2 + lVar6 * 8) =
                   xv2sigma2[lVar6] * dVar8 + *(double *)(v2sigma2 + lVar6 * 8);
              lVar6 = lVar6 + 1;
            } while (lVar5 - lVar6 != 0);
          }
          if ((iVar1 == 0x40) || (iVar1 == 4)) {
            uVar2 = pxVar3->flags;
            if ((short)uVar2 < 0) {
              lVar5 = (long)*(int *)((long)func + 0x74) * np;
              dVar8 = *(double *)(lVar4 + lVar7 * 8);
              if (lVar5 != 0) {
                lVar6 = 0;
                do {
                  *(double *)(v2rholapl + lVar6 * 8) =
                       xv2rholapl[lVar6] * dVar8 + *(double *)(v2rholapl + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while (lVar5 - lVar6 != 0);
                dVar8 = *(double *)(lVar4 + lVar7 * 8);
              }
              lVar5 = (long)(int)func[0x10] * np;
              if (lVar5 != 0) {
                lVar6 = 0;
                do {
                  *(double *)(v2sigmalapl + lVar6 * 8) =
                       xv2sigmalapl[lVar6] * dVar8 + *(double *)(v2sigmalapl + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while (lVar5 - lVar6 != 0);
                dVar8 = *(double *)(lVar4 + lVar7 * 8);
              }
              lVar5 = (long)(int)func[0x11] * np;
              if (lVar5 != 0) {
                lVar6 = 0;
                do {
                  *(double *)(v2lapl2 + lVar6 * 8) =
                       xv2lapl2[lVar6] * dVar8 + *(double *)(v2lapl2 + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while (lVar5 - lVar6 != 0);
              }
            }
            if ((uVar2 >> 0x10 & 1) != 0) {
              lVar5 = (long)(int)func[0xf] * np;
              dVar8 = *(double *)(lVar4 + lVar7 * 8);
              if (lVar5 != 0) {
                lVar6 = 0;
                do {
                  *(double *)(v2rhotau + lVar6 * 8) =
                       xv2rhotau[lVar6] * dVar8 + *(double *)(v2rhotau + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while (lVar5 - lVar6 != 0);
                dVar8 = *(double *)(lVar4 + lVar7 * 8);
              }
              lVar5 = (long)*(int *)((long)func + 0x84) * np;
              if (lVar5 != 0) {
                lVar6 = 0;
                do {
                  *(double *)(v2sigmatau + lVar6 * 8) =
                       xv2sigmatau[lVar6] * dVar8 + *(double *)(v2sigmatau + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while (lVar5 - lVar6 != 0);
                dVar8 = *(double *)(lVar4 + lVar7 * 8);
              }
              lVar5 = (long)(int)func[0x12] * np;
              if (lVar5 != 0) {
                lVar6 = 0;
                do {
                  *(double *)(v2tau2 + lVar6 * 8) =
                       xv2tau2[lVar6] * dVar8 + *(double *)(v2tau2 + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while (lVar5 - lVar6 != 0);
              }
              if (((~uVar2 & 0x18000) == 0) &&
                 (lVar5 = (long)*(int *)((long)func + 0x8c) * np, lVar5 != 0)) {
                dVar8 = *(double *)(lVar4 + lVar7 * 8);
                lVar4 = 0;
                do {
                  *(double *)(v2lapltau + lVar4 * 8) =
                       xv2lapltau[lVar4] * dVar8 + *(double *)(v2lapltau + lVar4 * 8);
                  lVar4 = lVar4 + 1;
                } while (lVar5 - lVar4 != 0);
              }
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)((long)func + 0xc));
  }
  xc_mgga_vars_free_all
            (xzk,xvrho,xvsigma,xvlapl,xvtau,xv2rho2,xv2rhosigma,xv2rholapl,xv2rhotau,xv2sigma2,
             xv2sigmalapl,xv2sigmatau,xv2lapl2,xv2lapltau,xv2tau2,xv3rho3,xv3rho2sigma,xv3rho2lapl,
             xv3rho2tau,xv3rhosigma2,xv3rhosigmalapl,xv3rhosigmatau,xv3rholapl2,xv3rholapltau,
             xv3rhotau2,xv3sigma3,xv3sigma2lapl,xv3sigma2tau,xv3sigmalapl2,xv3sigmalapltau,
             xv3sigmatau2,xv3lapl3,xv3lapl2tau,xv3lapltau2,xv3tau3,xv4rho4,xv4rho3sigma,xv4rho3lapl,
             xv4rho3tau,xv4rho2sigma2,xv4rho2sigmalapl,xv4rho2sigmatau,xv4rho2lapl2,xv4rho2lapltau,
             xv4rho2tau2,xv4rhosigma3,xv4rhosigma2lapl,xv4rhosigma2tau,xv4rhosigmalapl2,
             xv4rhosigmalapltau,xv4rhosigmatau2,xv4rholapl3,xv4rholapl2tau,xv4rholapltau2,xv4rhotau3
             ,xv4sigma4,xv4sigma3lapl,xv4sigma3tau,xv4sigma2lapl2,xv4sigma2lapltau,xv4sigma2tau2,
             xv4sigmalapl3,xv4sigmalapl2tau,xv4sigmalapltau2,xv4sigmatau3,xv4lapl4,xv4lapl3tau,
             xv4lapl2tau2);
  return;
}

Assistant:

void
xc_mix_func(const xc_func_type *func, size_t np,
            const double *rho, const double *sigma, const double *lapl, const double *tau,
            double *zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double *, ))
{
  const xc_func_type *aux;
  double *xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA *, x);
  int ii;

  const xc_dimensions *dim = &(func->dim);

  /* Sanity check: have we claimed the highest possible derivatives?
     First, check for the lowest common derivative (also need to make
     sure the derivatives have been compiled in!)
  */
  int have_vxc = XC_FLAGS_I_HAVE_VXC;
  int have_fxc = XC_FLAGS_I_HAVE_FXC;
  int have_kxc = XC_FLAGS_I_HAVE_KXC;
  int have_lxc = XC_FLAGS_I_HAVE_LXC;
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    if(! (aux->info->flags & XC_FLAGS_HAVE_VXC))
      have_vxc = 0;
    if(! (aux->info->flags & XC_FLAGS_HAVE_FXC))
      have_fxc = 0;
    if(! (aux->info->flags & XC_FLAGS_HAVE_KXC))
      have_kxc = 0;
    if(! (aux->info->flags & XC_FLAGS_HAVE_LXC))
      have_lxc = 0;
  }
  /* Then, for the actual checks */
  assert(have_lxc == (func->info->flags & XC_FLAGS_I_HAVE_LXC));
  assert(have_kxc == (func->info->flags & XC_FLAGS_I_HAVE_KXC));
  assert(have_fxc == (func->info->flags & XC_FLAGS_I_HAVE_FXC));
  assert(have_vxc == (func->info->flags & XC_FLAGS_I_HAVE_VXC));

  /* Sanity check: if component needs the Laplacian, then the mix
     must require it too */
  int need_laplacian = 0;
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
      need_laplacian = XC_FLAGS_NEEDS_LAPLACIAN;
  }
  assert((func->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) == need_laplacian);
  /* Same for tau */
  int need_tau = 0;
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    if(aux->info->flags & XC_FLAGS_NEEDS_TAU)
      need_tau = XC_FLAGS_NEEDS_TAU;
  }
  assert((func->info->flags & XC_FLAGS_NEEDS_TAU) == need_tau);

  /* Check compatibility of the individual components */
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];
    /* Sanity check: if component is GGA or meta-GGA, mix functional
       must also be GGA or meta-GGA */
    if(is_gga(aux->info->family))
      assert(is_gga(func->info->family));
    if(is_mgga(aux->info->family) && !is_mgga(func->info->family))
      assert(is_mgga(func->info->family));
    /* Sanity checks: if mix functional has higher derivatives, these
       must also exist in the individual components */
    if(func->info->flags & XC_FLAGS_HAVE_VXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_VXC);
    if(func->info->flags & XC_FLAGS_HAVE_FXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_FXC);
    if(func->info->flags & XC_FLAGS_HAVE_KXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_KXC);
    if(func->info->flags & XC_FLAGS_HAVE_LXC)
      assert(aux->info->flags & XC_FLAGS_HAVE_LXC);
  }

  /* prepare buffers that will hold the results from the individual functionals */
  xzk MGGA_OUT_PARAMS_NO_EXC(=, x) = NULL;

  /* allocate buffers */
  xc_mgga_vars_allocate_all(func->info->family, np, dim,
                            zk != NULL, vrho != NULL, v2rho2 != NULL, v3rho3 != NULL, v4rho4 != NULL,
                            &xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA &, x));

  /* Proceed by computing the mix */
  for(ii=0; ii<func->n_func_aux; ii++){
    aux = func->func_aux[ii];

    /* Evaluate the functional */
    switch(aux->info->family){
    case XC_FAMILY_LDA:
    case XC_FAMILY_HYB_LDA:
      xc_lda(aux, np, rho,
             xzk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
      break;
    case XC_FAMILY_GGA:
    case XC_FAMILY_HYB_GGA:
      xc_gga(aux, np, rho, sigma,
             xzk GGA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
      break;
    case XC_FAMILY_MGGA:
    case XC_FAMILY_HYB_MGGA:
      xc_mgga(aux, np, rho, sigma, lapl, tau,
              xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
      break;
    }

    /* Do the mixing */
    if(zk != NULL) {
      sum_var(zk);
    }

 #ifndef XC_DONT_COMPILE_VXC
    if(vrho != NULL) {
      sum_var(vrho);

      if(is_gga(aux->info->family)) {
        sum_var(vsigma);
      }

      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(vlapl);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(vtau);
        }
      }
    }

#ifndef XC_DONT_COMPILE_FXC
    if(v2rho2 != NULL){
      sum_var(v2rho2);

      if(is_gga(aux->info->family)) {
        sum_var(v2rhosigma);
        sum_var(v2sigma2);
      }

      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(v2rholapl);
          sum_var(v2sigmalapl);
          sum_var(v2lapl2);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(v2rhotau);
          sum_var(v2sigmatau);
          sum_var(v2tau2);
        }
        if((aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (aux->info->flags & XC_FLAGS_NEEDS_TAU)) {
          sum_var(v2lapltau);
        }
      }
    }

#ifndef XC_DONT_COMPILE_KXC
    if(v3rho3 != NULL){
      sum_var(v3rho3);

      if(is_gga(aux->info->family)) {
        sum_var(v3rho2sigma);
        sum_var(v3rhosigma2);
        sum_var(v3sigma3);
      }

      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(v3rho2lapl);
          sum_var(v3rhosigmalapl);
          sum_var(v3rholapl2);
          sum_var(v3sigma2lapl);
          sum_var(v3sigmalapl2);
          sum_var(v3lapl3);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(v3rho2tau);
          sum_var(v3rhosigmatau);
          sum_var(v3rhotau2);
          sum_var(v3sigma2tau);
          sum_var(v3sigmatau2);
          sum_var(v3tau3);
        }
        if((aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (aux->info->flags & XC_FLAGS_NEEDS_TAU)) {
          sum_var(v3rholapltau);
          sum_var(v3sigmalapltau);
          sum_var(v3lapl2tau);
          sum_var(v3lapltau2);
        }
      }
    }

#ifndef XC_DONT_COMPILE_LXC
    if(v4rho4 != NULL){
      sum_var(v4rho4);

      if(is_gga(aux->info->family)) {
        sum_var(v4rho3sigma);
        sum_var(v4rho2sigma2);
        sum_var(v4rhosigma3);
        sum_var(v4sigma4);
      }
      if(is_mgga(aux->info->family)) {
        if(aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) {
          sum_var(v4rho3lapl);
          sum_var(v4rho2sigmalapl);
          sum_var(v4rho2lapl2);
          sum_var(v4rhosigma2lapl);
          sum_var(v4rhosigmalapl2);
          sum_var(v4rholapl3);
          sum_var(v4sigma3lapl);
          sum_var(v4sigma2lapl2);
          sum_var(v4sigmalapl3);
          sum_var(v4lapl4);
        }
        if(aux->info->flags & XC_FLAGS_NEEDS_TAU) {
          sum_var(v4rho3tau);
          sum_var(v4rho2sigmatau);
          sum_var(v4rho2tau2);
          sum_var(v4rhosigma2tau);
          sum_var(v4rhosigmatau2);
          sum_var(v4rhotau3);
          sum_var(v4sigma3tau);
          sum_var(v4sigma2tau2);
          sum_var(v4sigmatau3);
          sum_var(v4tau4);
        }
        if((aux->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (aux->info->flags & XC_FLAGS_NEEDS_TAU)) {
          sum_var(v4rho2lapltau);
          sum_var(v4rhosigmalapltau);
          sum_var(v4rholapl2tau);
          sum_var(v4rholapltau2);
          sum_var(v4sigma2lapltau);
          sum_var(v4sigmalapl2tau);
          sum_var(v4sigmalapltau2);
          sum_var(v4lapl3tau);
          sum_var(v4lapl2tau2);
          sum_var(v4lapltau3);
        }
      }
    }
#endif
#endif
#endif
#endif
  } /* end functional loop */

  /* deallocate internal buffers */
  xc_mgga_vars_free_all(xzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, x));
}